

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,
          ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_>
          *bVal)

{
  ChNameValue<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_> local_28
  ;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  out<chrono::ChVector<int>>(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }